

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

void __thiscall
GLRParser::removeDuplicates
          (GLRParser *this,
          vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
          *possibleParseStacks)

{
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  *this_00;
  ulong uVar1;
  size_type sVar2;
  reference __value;
  difference_type dVar3;
  __normal_iterator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_*,_std::vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>_>
  local_48;
  __normal_iterator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_*,_std::vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>_>
  local_40;
  const_iterator local_38;
  __normal_iterator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_*,_std::vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>_>
  local_30;
  __normal_iterator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_*,_std::vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>_>
  local_28;
  int local_1c;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  *pvStack_18;
  int j;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  *possibleParseStacks_local;
  GLRParser *this_local;
  
  local_1c = 0;
  pvStack_18 = possibleParseStacks;
  possibleParseStacks_local =
       (vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
        *)this;
  while( true ) {
    uVar1 = (ulong)local_1c;
    sVar2 = std::
            vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
            ::size(pvStack_18);
    if (sVar2 <= uVar1) break;
    local_28._M_current =
         (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
          *)std::
            vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
            ::begin(pvStack_18);
    local_30._M_current =
         (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
          *)std::
            vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
            ::end(pvStack_18);
    __value = std::
              vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
              ::operator[](pvStack_18,(long)local_1c);
    dVar3 = std::
            count<__gnu_cxx::__normal_iterator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>*,std::vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
                      (local_28,local_30,__value);
    this_00 = pvStack_18;
    if (1 < dVar3) {
      local_48._M_current =
           (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
            *)std::
              vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
              ::begin(pvStack_18);
      local_40 = __gnu_cxx::
                 __normal_iterator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_*,_std::vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>_>
                 ::operator+(&local_48,(long)local_1c);
      __gnu_cxx::
      __normal_iterator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>const*,std::vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>>
      ::
      __normal_iterator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>*>
                ((__normal_iterator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>const*,std::vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>>
                  *)&local_38,&local_40);
      std::
      vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ::erase(this_00,local_38);
      local_1c = local_1c + -1;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void
GLRParser::removeDuplicates(
        vector<std::pair<std::stack<std::string>, std::stack<Production *>>> &possibleParseStacks) const {// if there are two identical stacks, remove one of them
    for (int j = 0; j < possibleParseStacks.size(); ++j) {
        if (count(possibleParseStacks.begin(), possibleParseStacks.end(), possibleParseStacks[j]) > 1) {
            possibleParseStacks.erase(possibleParseStacks.begin() + j);
            j--;
        }
    }
}